

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O0

string * replaceGlobal(string *__return_storage_ptr__,string *targetString,string *oldValue,
                      string *newValue)

{
  undefined8 uVar1;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string preOld;
  size_t targetPos;
  allocator<char> local_2e;
  undefined1 local_2d;
  int local_2c;
  string *psStack_28;
  int pos;
  string *newValue_local;
  string *oldValue_local;
  string *targetString_local;
  string *resultString;
  
  local_2c = 0;
  local_2d = 0;
  psStack_28 = newValue;
  newValue_local = oldValue;
  oldValue_local = targetString;
  targetString_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  preOld.field_2._8_8_ = std::__cxx11::string::find((string *)targetString,(ulong)oldValue);
  while (preOld.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)targetString);
    std::operator+(&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   newValue);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    uVar1 = preOld.field_2._8_8_;
    local_2c = std::__cxx11::string::length();
    local_2c = (int)uVar1 + local_2c;
    preOld.field_2._8_8_ = std::__cxx11::string::find((string *)targetString,(ulong)oldValue);
    std::__cxx11::string::~string((string *)local_68);
  }
  std::__cxx11::string::substr((ulong)local_a8,(ulong)targetString);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a8);
  std::__cxx11::string::~string(local_a8);
  return __return_storage_ptr__;
}

Assistant:

string replaceGlobal( string targetString, string oldValue, string newValue ) {
    int pos = 0;
    string resultString = "";
    size_t targetPos = targetString.find( oldValue, pos );
    while( targetPos != string::npos ) {
        string preOld = targetString.substr( pos, targetPos - pos );
        resultString += preOld + newValue;
        pos = targetPos + oldValue.length();
        targetPos = targetString.find( oldValue, pos );
    }
    resultString += targetString.substr(pos);
    return resultString;
}